

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

void __thiscall
unodb::detail::
db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::operator()(db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             *this,leaf_type *to_delete)

{
  qsbr_per_thread *this_00;
  size_t size;
  code *local_40 [2];
  code *local_30;
  code *local_28;
  
  size = (ulong)to_delete->key_size + (ulong)to_delete->value_size + 0x27;
  this_00 = qsbr_per_thread::get_instance();
  local_40[1] = (code *)0x0;
  local_40[0] = olc_node_header::check_on_dealloc;
  local_28 = std::_Function_handler<void_(const_void_*),_void_(*)(const_void_*)_noexcept>::_M_invoke
  ;
  local_30 = std::_Function_handler<void_(const_void_*),_void_(*)(const_void_*)_noexcept>::
             _M_manager;
  qsbr_per_thread::on_next_epoch_deallocate(this_00,to_delete,size,(debug_callback *)local_40);
  std::_Function_base::~_Function_base((_Function_base *)local_40);
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::decrement_leaf_count(this->db_instance,size);
  return;
}

Assistant:

void operator()(leaf_type* to_delete) const {
#ifdef UNODB_DETAIL_WITH_STATS
    const auto leaf_size = to_delete->get_size();
#endif  // UNODB_DETAIL_WITH_STATS

    this_thread().on_next_epoch_deallocate(to_delete
#ifdef UNODB_DETAIL_WITH_STATS
                                           ,
                                           leaf_size
#endif  // UNODB_DETAIL_WITH_STATS
#ifndef NDEBUG
                                           ,
                                           olc_node_header::check_on_dealloc
#endif
    );

#ifdef UNODB_DETAIL_WITH_STATS
    db_instance.decrement_leaf_count(leaf_size);
#endif  // UNODB_DETAIL_WITH_STATS
  }